

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

void __thiscall
testing::internal::
ElementsAreMatcherImpl<std::vector<unsigned_long,std::allocator<unsigned_long>>const&>::
ElementsAreMatcherImpl<__gnu_cxx::__normal_iterator<testing::Matcher<unsigned_long_const&>*,std::vector<testing::Matcher<unsigned_long_const&>,std::allocator<testing::Matcher<unsigned_long_const&>>>>>
          (ElementsAreMatcherImpl<std::vector<unsigned_long,std::allocator<unsigned_long>>const&>
           *this,__normal_iterator<testing::Matcher<const_unsigned_long_&>_*,_std::vector<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>_>
                 first,
          __normal_iterator<testing::Matcher<const_unsigned_long_&>_*,_std::vector<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>_>
          last)

{
  MatcherBase<const_unsigned_long_&> local_48;
  
  *(undefined ***)this = &PTR__ElementsAreMatcherImpl_001bc350;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  if (first._M_current != last._M_current) {
    do {
      local_48.vtable_ = ((first._M_current)->super_MatcherBase<const_unsigned_long_&>).vtable_;
      local_48.buffer_ =
           (Buffer)((first._M_current)->super_MatcherBase<const_unsigned_long_&>).buffer_.shared;
      if ((local_48.vtable_ != (VTable *)0x0) &&
         ((local_48.vtable_)->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
        LOCK();
        ((local_48.buffer_.shared)->ref).super___atomic_base<int>._M_i =
             ((local_48.buffer_.shared)->ref).super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_48.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
           (_func_int **)&PTR__MatcherBase_001bc1a0;
      std::
      vector<testing::Matcher<unsigned_long_const&>,std::allocator<testing::Matcher<unsigned_long_const&>>>
      ::emplace_back<testing::Matcher<unsigned_long_const&>>
                ((vector<testing::Matcher<unsigned_long_const&>,std::allocator<testing::Matcher<unsigned_long_const&>>>
                  *)(this + 8),(Matcher<const_unsigned_long_&> *)&local_48);
      first._M_current = first._M_current + 1;
      MatcherBase<const_unsigned_long_&>::~MatcherBase(&local_48);
    } while (first._M_current != last._M_current);
  }
  return;
}

Assistant:

ElementsAreMatcherImpl(InputIter first, InputIter last) {
    while (first != last) {
      matchers_.push_back(MatcherCast<const Element&>(*first++));
    }
  }